

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

Belief * __thiscall despot::FullChainBelief::MakeCopy(FullChainBelief *this)

{
  pointer pvVar1;
  undefined8 *puVar2;
  FullChainBelief *this_00;
  
  this_00 = (FullChainBelief *)operator_new(0x60);
  pvVar1 = (this->alpha_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined8 **)
            &(pvVar1->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data;
  FullChainBelief(this_00,*(DSPOMDP **)&this->field_0x8,
                  (int)((ulong)((long)(this->alpha_).
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >>
                       3) * -0x55555555,
                  (int)((ulong)((long)*(pointer *)
                                       ((long)&(pvVar1->
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               )._M_impl.super__Vector_impl_data + 8) - (long)puVar2
                               ) >> 3) * -0x55555555,*(double *)*puVar2);
  return &this_00->super_Belief;
}

Assistant:

Belief* FullChainBelief::MakeCopy() const {
	return new FullChainBelief(model_, alpha_.size(), alpha_[0].size(),
		alpha_[0][0][0]);
}